

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O2

int ref_nonsingle_cell(saucy *s,coloring *c,int cf)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  int *piVar4;
  int *piVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  
  piVar2 = c->lab;
  lVar7 = (long)cf;
  lVar8 = c->clen[lVar7] + lVar7;
  lVar12 = (long)(int)lVar8 - (long)s->conncnts[lVar7];
  uVar16 = lVar12 + 1;
  uVar10 = uVar16 & 0xffffffff;
  piVar3 = s->ccount;
  piVar4 = s->count;
  uVar9 = piVar3[piVar2[lVar12 + 1]];
  lVar7 = (long)(int)uVar9;
  piVar4[lVar12 + 1] = uVar9;
  piVar5 = s->bucket;
  piVar5[lVar7] = 1;
  uVar13 = (ulong)uVar9;
  uVar14 = uVar16;
  while( true ) {
    iVar6 = (int)lVar7;
    iVar11 = (int)uVar13;
    if (lVar8 <= (long)uVar14) break;
    uVar14 = uVar14 + 1;
    iVar1 = piVar3[piVar2[uVar14]];
    lVar12 = (long)iVar1;
    for (lVar7 = (long)iVar6; lVar12 < lVar7; lVar7 = lVar7 + -1) {
      piVar5[lVar7 + -1] = 0;
    }
    for (uVar13 = (ulong)iVar11; (long)uVar13 < lVar12; uVar13 = uVar13 + 1) {
      piVar5[uVar13 + 1] = 0;
    }
    piVar5[lVar12] = piVar5[lVar12] + 1;
    piVar4[uVar14] = iVar1;
  }
  if (((int)uVar16 != cf) || (iVar6 != iVar11)) {
    lVar15 = (long)iVar11;
    lVar12 = (long)iVar6;
    for (lVar7 = lVar12; uVar14 = uVar16, lVar7 <= lVar15; lVar7 = lVar7 + 1) {
      if (piVar5[lVar7] != 0) {
        uVar9 = (int)uVar10 + piVar5[lVar7];
        uVar10 = (ulong)uVar9;
        piVar5[lVar7] = uVar9;
      }
    }
    for (; (long)uVar14 <= lVar8; uVar14 = uVar14 + 1) {
      iVar6 = piVar2[uVar14];
      piVar3 = s->junk;
      iVar11 = piVar5[piVar4[uVar14]];
      piVar5[piVar4[uVar14]] = iVar11 + -1;
      piVar3[(long)iVar11 + -1] = iVar6;
    }
    for (; (long)uVar16 <= lVar8; uVar16 = uVar16 + 1) {
      iVar6 = s->junk[uVar16];
      piVar2[uVar16] = iVar6;
      c->unlab[iVar6] = (int)uVar16;
    }
    for (; lVar12 < lVar15; lVar15 = lVar15 + -1) {
      iVar6 = s->bucket[lVar15];
      if ((iVar6 != 0) && (iVar6 = (*s->split)(s,c,cf,iVar6), iVar6 == 0)) {
        return 0;
      }
    }
    iVar6 = s->bucket[lVar12];
    if (iVar6 != cf) {
      iVar6 = (*s->split)(s,c,cf,iVar6);
      return iVar6;
    }
  }
  return 1;
}

Assistant:

static int
ref_nonsingle_cell(struct saucy *s, struct coloring *c, int cf)
{
    int cnt, i, cb, nzf, ff, fb, bmin, bmax;

    /* Find the front and back */
    cb = cf + c->clen[cf];
    nzf = cb - s->conncnts[cf] + 1;

    /* Prepare the buckets */
    ff = nzf;
    cnt = s->ccount[c->lab[ff]];
    s->count[ff] = bmin = bmax = cnt;
    s->bucket[cnt] = 1;

    /* Iterate through the rest of the vertices */
    while (++ff <= cb) {
        cnt = s->ccount[c->lab[ff]];

        /* Initialize intermediate buckets */
        while (bmin > cnt) s->bucket[--bmin] = 0;
        while (bmax < cnt) s->bucket[++bmax] = 0;

        /* Mark this count */
        ++s->bucket[cnt];
        s->count[ff] = cnt;
    }

    /* If they all had the same count, bail */
    if (bmin == bmax && cf == nzf) return 1;
    ff = fb = nzf;

    /* Calculate bucket locations, sizes */
    for (i = bmin; i <= bmax; ++i, ff = fb) {
        if (!s->bucket[i]) continue;
        fb = ff + s->bucket[i];
        s->bucket[i] = fb;
    }

    /* Repair the partition nest */
    for (i = nzf; i <= cb; ++i) {
        s->junk[--s->bucket[s->count[i]]] = c->lab[i];
    }
    for (i = nzf; i <= cb; ++i) {
        set_label(c, i, s->junk[i]);
    }

    /* Split; induce */
    for (i = bmax; i > bmin; --i) {
        ff = s->bucket[i];
        if (ff && !s->split(s, c, cf, ff)) return 0;
    }

    /* If there was a zero area, then there's one more cell */
    return maybe_split(s, c, cf, s->bucket[bmin]);
}